

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int xml_writer_create(xml_writer **pctx)

{
  xml_writer *__ptr;
  xmlBufferPtr pxVar1;
  xmlTextWriterPtr pxVar2;
  xml_writer *ctx;
  xml_writer **pctx_local;
  
  __ptr = (xml_writer *)calloc(1,0x18);
  if (__ptr == (xml_writer *)0x0) {
    pctx_local._4_4_ = -1;
  }
  else {
    pxVar1 = (xmlBufferPtr)xmlBufferCreate();
    __ptr->bp = pxVar1;
    if (__ptr->bp == (xmlBufferPtr)0x0) {
      free(__ptr);
      pctx_local._4_4_ = -1;
    }
    else {
      pxVar2 = (xmlTextWriterPtr)xmlNewTextWriterMemory(__ptr->bp,0);
      __ptr->writer = pxVar2;
      if (__ptr->writer == (xmlTextWriterPtr)0x0) {
        xmlBufferFree(__ptr->bp);
        free(__ptr);
        pctx_local._4_4_ = -1;
      }
      else {
        *pctx = __ptr;
        pctx_local._4_4_ = 0;
      }
    }
  }
  return pctx_local._4_4_;
}

Assistant:

static int
xml_writer_create(struct xml_writer **pctx)
{
	struct xml_writer *ctx = calloc(1, sizeof(struct xml_writer));
	if (ctx == NULL) {
		return (-1);
	}

	ctx->bp = xmlBufferCreate();
	if (ctx->bp == NULL) {
		free(ctx);
		return (-1);
	}

	ctx->writer = xmlNewTextWriterMemory(ctx->bp, 0);
	if (ctx->writer == NULL) {
		xmlBufferFree(ctx->bp);
		free(ctx);
		return (-1);
	}

	*pctx = ctx;
	return (0);
}